

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

int ON_Solve3x3(double *row0,double *row1,double *row2,double d0,double d1,double d2,double *x_addr,
               double *y_addr,double *z_addr,double *pivot_ratio)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  double *pdVar6;
  double *pdVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dStack_f8;
  int sizeof_row;
  double minpiv;
  double maxpiv;
  double workarray [12];
  double y;
  double x;
  double *p2;
  double *p1;
  double *p0;
  int j;
  int i;
  double *z_addr_local;
  double *y_addr_local;
  double *x_addr_local;
  double d2_local;
  double d1_local;
  double d0_local;
  double *row2_local;
  double *row1_local;
  double *row0_local;
  
  *z_addr = 0.0;
  *y_addr = 0.0;
  *x_addr = 0.0;
  *pivot_ratio = 0.0;
  cVar1 = ABS(*row0) < ABS(row0[1]);
  y = ABS(*row0);
  if ((bool)cVar1) {
    y = ABS(row0[1]);
  }
  if (y < ABS(row0[2])) {
    cVar1 = '\x02';
    y = ABS(row0[2]);
  }
  dVar8 = ABS(*row1);
  bVar2 = y < dVar8;
  if (bVar2) {
    cVar1 = '\0';
    y = dVar8;
  }
  dVar8 = ABS(row1[1]);
  bVar3 = y < dVar8;
  if (bVar3) {
    cVar1 = '\x01';
    y = dVar8;
  }
  dVar8 = ABS(row1[2]);
  bVar4 = y < dVar8;
  if (bVar4) {
    cVar1 = '\x02';
    y = dVar8;
  }
  cVar5 = bVar4 || (bVar3 || bVar2);
  if (y < ABS(*row2)) {
    cVar5 = '\x02';
    cVar1 = '\0';
    y = ABS(*row2);
  }
  if (y < ABS(row2[1])) {
    cVar5 = '\x02';
    cVar1 = '\x01';
    y = ABS(row2[1]);
  }
  if (y < ABS(row2[2])) {
    cVar5 = '\x02';
    cVar1 = '\x02';
    y = ABS(row2[2]);
  }
  if ((y != 0.0) || (NAN(y))) {
    dStack_f8 = ABS(y);
    workarray[10] = d2;
    if (cVar5 == '\x01') {
      maxpiv = *row1;
      workarray[0] = row1[1];
      workarray[1] = row1[2];
      workarray[3] = *row0;
      workarray[4] = row0[1];
      workarray[5] = row0[2];
      workarray[7] = *row2;
      workarray[8] = row2[1];
      workarray[9] = row2[2];
      workarray[2] = d1;
      workarray[6] = d0;
    }
    else {
      workarray[6] = d1;
      if (cVar5 == '\x02') {
        maxpiv = *row2;
        workarray[0] = row2[1];
        workarray[1] = row2[2];
        workarray[3] = *row1;
        workarray[4] = row1[1];
        workarray[5] = row1[2];
        workarray[7] = *row0;
        workarray[8] = row0[1];
        workarray[9] = row0[2];
        workarray[2] = d2;
        workarray[10] = d0;
      }
      else {
        maxpiv = *row0;
        workarray[0] = row0[1];
        workarray[1] = row0[2];
        workarray[3] = *row1;
        workarray[4] = row1[1];
        workarray[5] = row1[2];
        workarray[7] = *row2;
        workarray[8] = row2[1];
        workarray[9] = row2[2];
        workarray[2] = d0;
      }
    }
    dVar10 = workarray[7];
    dVar9 = workarray[3];
    dVar8 = maxpiv;
    _j = z_addr;
    if (cVar1 == '\x01') {
      maxpiv = workarray[0];
      workarray[0] = dVar8;
      workarray[3] = workarray[4];
      workarray[4] = dVar9;
      workarray[7] = workarray[8];
      workarray[8] = dVar10;
      z_addr_local = x_addr;
      y_addr_local = y_addr;
    }
    else {
      z_addr_local = y_addr;
      y_addr_local = x_addr;
      if (cVar1 == '\x02') {
        maxpiv = workarray[1];
        workarray[1] = dVar8;
        workarray[3] = workarray[5];
        workarray[5] = dVar9;
        workarray[7] = workarray[9];
        workarray[9] = dVar10;
        _j = x_addr;
        y_addr_local = z_addr;
      }
    }
    pdVar7 = z_addr_local;
    dVar8 = 1.0 / maxpiv;
    dVar9 = dVar8 * workarray[0];
    workarray[1] = dVar8 * workarray[1];
    workarray[2] = dVar8 * workarray[2];
    dVar8 = -workarray[3];
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      workarray[4] = dVar8 * dVar9 + workarray[4];
      workarray[5] = dVar8 * workarray[1] + workarray[5];
      workarray[6] = dVar8 * workarray[2] + workarray[6];
    }
    dVar8 = -workarray[7];
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      workarray[8] = dVar8 * dVar9 + workarray[8];
      workarray[9] = dVar8 * workarray[1] + workarray[9];
      workarray[10] = dVar8 * workarray[2] + workarray[10];
    }
    dVar8 = ABS(workarray[4]);
    dVar10 = ABS(workarray[5]);
    y = dVar8;
    if (dVar8 < dVar10) {
      y = dVar10;
    }
    bVar2 = y < ABS(workarray[8]);
    if (bVar2) {
      y = ABS(workarray[8]);
    }
    bVar3 = y < ABS(workarray[9]);
    if (bVar3) {
      y = ABS(workarray[9]);
    }
    if ((y != 0.0) || (NAN(y))) {
      dVar11 = ABS(y);
      minpiv = dVar11;
      if ((dVar11 <= dStack_f8) && (minpiv = dStack_f8, dVar11 < dStack_f8)) {
        dStack_f8 = dVar11;
      }
      workarray[0] = dVar9;
      if (bVar3 || !bVar2 && dVar8 < dVar10) {
        z_addr_local = _j;
        _j = pdVar7;
        workarray[0] = workarray[1];
        workarray[1] = dVar9;
      }
      if (bVar3 || bVar2) {
        p2 = workarray + 8;
        x = (double)(workarray + 4);
      }
      else {
        p2 = workarray + 4;
        x = (double)(workarray + 8);
      }
      pdVar7 = p2;
      dVar8 = x;
      p2[1] = (1.0 / *p2) * p2[1];
      p2[2] = (1.0 / *p2) * p2[2];
      dVar9 = -workarray[0];
      if ((dVar9 != 0.0) || (NAN(dVar9))) {
        workarray[1] = dVar9 * p2[1] + workarray[1];
        workarray[2] = dVar9 * p2[2] + workarray[2];
      }
      p2 = p2 + 1;
      dVar9 = -*(double *)x;
      if ((dVar9 != 0.0) || (NAN(dVar9))) {
        *(double *)((long)x + 8) = dVar9 * *p2 + *(double *)((long)x + 8);
        *(double *)((long)x + 0x10) = dVar9 * pdVar7[2] + *(double *)((long)x + 0x10);
      }
      x = (double)((long)x + 8);
      pdVar6 = (double *)((long)dVar8 + 0x10);
      dVar8 = *(double *)x;
      if ((dVar8 != 0.0) || (NAN(dVar8))) {
        dVar10 = ABS(dVar8);
        dVar9 = dVar10;
        if ((dVar10 <= minpiv) && (dVar9 = minpiv, dVar10 < dStack_f8)) {
          dStack_f8 = dVar10;
        }
        minpiv = dVar9;
        *pdVar6 = *pdVar6 / dVar8;
        pdVar7 = pdVar7 + 2;
        dVar8 = -*p2;
        if ((dVar8 != 0.0) || (NAN(dVar8))) {
          *pdVar7 = dVar8 * *pdVar6 + *pdVar7;
        }
        dVar8 = -workarray[1];
        if ((dVar8 != 0.0) || (NAN(dVar8))) {
          workarray[2] = dVar8 * *pdVar6 + workarray[2];
        }
        *y_addr_local = workarray[2];
        if (bVar3 || bVar2) {
          *z_addr_local = workarray[10];
          *_j = workarray[6];
        }
        else {
          *z_addr_local = workarray[6];
          *_j = workarray[10];
        }
        *pivot_ratio = dStack_f8 / minpiv;
        row0_local._4_4_ = 3;
      }
      else {
        row0_local._4_4_ = 2;
      }
    }
    else {
      row0_local._4_4_ = 1;
    }
  }
  else {
    row0_local._4_4_ = 0;
  }
  return row0_local._4_4_;
}

Assistant:

int
ON_Solve3x3(const double row0[3], const double row1[3], const double row2[3],
                double d0, double d1, double d2,
                double* x_addr, double* y_addr, double* z_addr,
                double* pivot_ratio)
{
  /* Solve a 3x3 linear system using Gauss-Jordan elimination 
   * with full pivoting.
   */
  int i, j;
  double* p0;
  double* p1;
  double* p2;
  double x, y, workarray[12], maxpiv, minpiv;

  const int sizeof_row = 3*sizeof(row0[0]);

  *pivot_ratio = *x_addr = *y_addr = *z_addr = 0.0;
  x = fabs(row0[0]); i=j=0;
  y = fabs(row0[1]); if (y>x) {x=y;j=1;}
  y = fabs(row0[2]); if (y>x) {x=y;j=2;}
  y = fabs(row1[0]); if (y>x) {x=y;i=1;j=0;}
  y = fabs(row1[1]); if (y>x) {x=y;i=1;j=1;}
  y = fabs(row1[2]); if (y>x) {x=y;i=1;j=2;}
  y = fabs(row2[0]); if (y>x) {x=y;i=2;j=0;}
  y = fabs(row2[1]); if (y>x) {x=y;i=2;j=1;}
  y = fabs(row2[2]); if (y>x) {x=y;i=2;j=2;}
  if (x == 0.0) 
    return 0;
  maxpiv = minpiv = fabs(x);
  p0 = workarray;
  switch(i) {
  case 1: /* swap rows 0 and 1 */
    memcpy(p0,row1,sizeof_row); p0[3] = d1; p0 += 4;
    memcpy(p0,row0,sizeof_row); p0[3] = d0; p0 += 4;
    memcpy(p0,row2,sizeof_row); p0[3] = d2;
    break;
  case 2: /* swap rows 0 and 2 */
    memcpy(p0,row2,sizeof_row); p0[3] = d2; p0 += 4;
    memcpy(p0,row1,sizeof_row); p0[3] = d1; p0 += 4;
    memcpy(p0,row0,sizeof_row); p0[3] = d0;
    break;
  default:
    memcpy(p0,row0,sizeof_row); p0[3] = d0; p0 += 4;
    memcpy(p0,row1,sizeof_row); p0[3] = d1; p0 += 4;
    memcpy(p0,row2,sizeof_row); p0[3] = d2;
    break;
  }
  switch(j) {
  case 1: /* swap columns 0 and 1 */
    p0 = x_addr; x_addr = y_addr; y_addr = p0;
    p0 = &workarray[0]; 
    x = p0[0]; p0[0]=p0[1]; p0[1]=x; p0 += 4;
    x = p0[0]; p0[0]=p0[1]; p0[1]=x; p0 += 4;
    x = p0[0]; p0[0]=p0[1]; p0[1]=x;
    break;
  case 2: /* swap columns 0 and 2 */
    p0 = x_addr; x_addr = z_addr; z_addr = p0;
    p0 = &workarray[0]; 
    x = p0[0]; p0[0]=p0[2]; p0[2]=x; p0 += 4;
    x = p0[0]; p0[0]=p0[2]; p0[2]=x; p0 += 4;
    x = p0[0]; p0[0]=p0[2]; p0[2]=x;
    break;
  }

  x = 1.0/workarray[0];
  /* debugger set workarray[0] = 1 */
  p0 = p1 = workarray + 1;
  *p1++ *= x; *p1++ *= x; *p1++ *= x;
  x = -(*p1++);
  /* debugger set workarray[4] = 0 */
  if (x == 0.0) 
    p1 += 3;
  else 
    {*p1++ += x*(*p0++); *p1++ += x*(*p0++); *p1++ += x*(*p0); p0 -= 2;}
  x = -(*p1++);
  /* debugger set workarray[8] = 0 */
  if (x != 0.0)
    {*p1++ += x*(*p0++); *p1++ += x*(*p0++); *p1++ += x*(*p0); p0 -= 2;}

  x = fabs(workarray[ 5]);i=j=0;
  y = fabs(workarray[ 6]);if (y>x) {x=y;j=1;}
  y = fabs(workarray[ 9]);if (y>x) {x=y;i=1;j=0;}
  y = fabs(workarray[10]);if (y>x) {x=y;i=j=1;}
  if (x == 0.0) 
    return 1; // rank = 1;
  y = fabs(x);
  if (y > maxpiv) maxpiv = y; else if (y < minpiv) minpiv = y;
  if (j) {
    /* swap columns 1 and 2 */
    p0 = workarray+1;
    p1 = p0+1;
    x = *p0; *p0 = *p1; *p1 = x; p0 += 4; p1 += 4;
    x = *p0; *p0 = *p1; *p1 = x; p0 += 4; p1 += 4;
    x = *p0; *p0 = *p1; *p1 = x; p0 += 4; p1 += 4;
    p0 = y_addr; y_addr = z_addr; z_addr = p0;
  }

  if (i) {
    /* pivot is in row 2 */
    p0 = workarray+1;
    p1 = p0 + 8;
    p2 = p0 + 4;
  }
  else {
    /* pivot is in row 1 */
    p0 = workarray+1;
    p1 = p0 + 4;
    p2 = p0 + 8;
  }

  /* debugger set workarray[5+4*i] = 1 */
  x = 1.0/(*p1++); *p1++ *= x; *p1 *= x; p1--;
  x = -(*p0++);
  /* debugger set p0[-1] = 0 */
  if (x != 0.0) {*p0++ += x*(*p1++); *p0 += x*(*p1); p0--; p1--;}
  x = -(*p2++);
  /* debugger set p2[-1] = 0 */
  if (x != 0.0) {*p2++ += x*(*p1++); *p2 += x*(*p1); p2--; p1--;}
  x = *p2++;
  if (x == 0.0) 
    return 2; // rank = 2;
  y = fabs(x);
  if (y > maxpiv) maxpiv = y; else if (y < minpiv) minpiv = y;
  /* debugger set p2[-1] = 1 */
  *p2 /= x;
  x = -(*p1++);  if (x != 0.0) *p1 += x*(*p2);
  /* debugger set p1[-1] = 0 */
  x = -(*p0++);  if (x != 0.0) *p0 += x*(*p2);
  /* debugger set p0[-1] = 0 */
  *x_addr = workarray[3];
  if (i) {
    *y_addr = workarray[11];
    *z_addr = workarray[7];
  }
  else {
    *y_addr = workarray[7];
    *z_addr = workarray[11];
  }
  *pivot_ratio = minpiv/maxpiv;
  return 3;
}